

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O2

int vector_count_add(flatcc_builder_t *B,flatbuffers_uoffset_t count,flatbuffers_uoffset_t max_count
                    )

{
  flatbuffers_uoffset_t *pfVar1;
  uint uVar2;
  
  pfVar1 = &(B->frame->container).table.pl_end;
  uVar2 = count + *pfVar1;
  if ((!CARRY4(count,*pfVar1)) && (uVar2 <= max_count)) {
    (B->frame->container).table.pl_end = uVar2;
    return 0;
  }
  __assert_fail("n <= n1 && n1 <= max_count",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                ,0x391,
                "int vector_count_add(flatcc_builder_t *, flatbuffers_uoffset_t, flatbuffers_uoffset_t)"
               );
}

Assistant:

static inline int vector_count_add(flatcc_builder_t *B, uoffset_t count, uoffset_t max_count)
{
    uoffset_t n, n1;
    n = frame(container.vector.count);
    n1 = n + count;
    /*
     * This prevents elem_size * count from overflowing iff max_vector
     * has been set sensible. Without this check we might allocate to
     * little on the ds stack and return a buffer the user thinks is
     * much larger which of course is bad even though the buffer eventually
     * would fail anyway.
     */
    check_error(n <= n1 && n1 <= max_count, -1, "vector too large to represent");
    frame(container.vector.count) = n1;
    return 0;
}